

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_appender<char> __thiscall
fmt::v11::detail::digit_grouping<char>::apply<fmt::v11::basic_appender<char>,char>
          (digit_grouping<char> *this,basic_appender<char> out,basic_string_view<char> digits)

{
  int iVar1;
  make_unsigned_t<int> mVar2;
  size_t sVar3;
  int *piVar4;
  char *pcVar5;
  buffer<char> *in_RSI;
  long in_RDI;
  basic_appender<char> out_00;
  next_state nVar6;
  int sep_index;
  int i_1;
  int i;
  next_state state;
  basic_memory_buffer<int,_500UL,_fmt::v11::detail::allocator<int>_> separators;
  int num_digits;
  undefined7 in_stack_fffffffffffff728;
  char in_stack_fffffffffffff72f;
  undefined4 in_stack_fffffffffffff730;
  int in_stack_fffffffffffff734;
  next_state *in_stack_fffffffffffff750;
  undefined4 in_stack_fffffffffffff758;
  undefined4 in_stack_fffffffffffff75c;
  basic_appender<char> local_880;
  buffer<char> *local_878;
  buffer<char> *local_870;
  int local_864;
  int local_860;
  int local_85c;
  char *local_858;
  int local_850;
  char *local_848;
  int local_840;
  undefined4 local_828;
  buffer<int> local_820 [63];
  int local_2c;
  basic_string_view<char> local_20;
  basic_appender<char> local_10;
  buffer<char> *local_8;
  
  local_10.container = in_RSI;
  sVar3 = basic_string_view<char>::size(&local_20);
  local_2c = (int)sVar3;
  basic_memory_buffer<int,_500UL,_fmt::v11::detail::allocator<int>_>::basic_memory_buffer
            ((basic_memory_buffer<int,_500UL,_fmt::v11::detail::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
             (allocator<int> *)CONCAT17(in_stack_fffffffffffff72f,in_stack_fffffffffffff728));
  local_828 = 0;
  buffer<int>::push_back
            ((buffer<int> *)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
             (int *)CONCAT17(in_stack_fffffffffffff72f,in_stack_fffffffffffff728));
  nVar6 = initial_state((digit_grouping<char> *)0x40160b);
  local_858 = (char *)nVar6.group._M_current;
  local_850 = nVar6.pos;
  local_848 = local_858;
  local_840 = local_850;
  while ((local_85c = next((digit_grouping<char> *)
                           CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
                           in_stack_fffffffffffff750), local_85c != 0 && (local_85c < local_2c))) {
    buffer<int>::push_back
              ((buffer<int> *)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
               (int *)CONCAT17(in_stack_fffffffffffff72f,in_stack_fffffffffffff728));
  }
  local_860 = 0;
  sVar3 = buffer<int>::size(local_820);
  local_864 = (int)sVar3 + -1;
  for (; local_860 < local_2c; local_860 = local_860 + 1) {
    iVar1 = local_2c - local_860;
    piVar4 = buffer<int>::operator[]<int>(local_820,local_864);
    if (iVar1 == *piVar4) {
      out_00.container = (buffer<char> *)(in_RDI + 0x20);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x401721);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x401730);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 out_00.container);
      local_878 = local_10.container;
      local_870 = (buffer<char> *)
                  copy<char,_const_char_*,_fmt::v11::basic_appender<char>,_0>
                            ((char *)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
                             (char *)CONCAT17(in_stack_fffffffffffff72f,in_stack_fffffffffffff728),
                             out_00);
      local_864 = local_864 + -1;
      local_10 = (basic_appender<char>)local_870;
    }
    mVar2 = to_unsigned<int>(0);
    pcVar5 = basic_string_view<char>::operator[](&local_20,(ulong)mVar2);
    in_stack_fffffffffffff734 = (int)*pcVar5;
    local_880 = basic_appender<char>::operator++(&local_10,0);
    basic_appender<char>::operator*(&local_880);
    basic_appender<char>::operator=
              ((basic_appender<char> *)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730)
               ,in_stack_fffffffffffff72f);
  }
  local_8 = local_10.container;
  basic_memory_buffer<int,_500UL,_fmt::v11::detail::allocator<int>_>::~basic_memory_buffer
            ((basic_memory_buffer<int,_500UL,_fmt::v11::detail::allocator<int>_> *)0x401808);
  return (basic_appender<char>)local_8;
}

Assistant:

auto apply(Out out, basic_string_view<C> digits) const -> Out {
    auto num_digits = static_cast<int>(digits.size());
    auto separators = basic_memory_buffer<int>();
    separators.push_back(0);
    auto state = initial_state();
    while (int i = next(state)) {
      if (i >= num_digits) break;
      separators.push_back(i);
    }
    for (int i = 0, sep_index = static_cast<int>(separators.size() - 1);
         i < num_digits; ++i) {
      if (num_digits - i == separators[sep_index]) {
        out = copy<Char>(thousands_sep_.data(),
                         thousands_sep_.data() + thousands_sep_.size(), out);
        --sep_index;
      }
      *out++ = static_cast<Char>(digits[to_unsigned(i)]);
    }
    return out;
  }